

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaAccuracy.cpp
# Opt level: O1

void __thiscall
glcts::GPUShader5FmaAccuracyTest::logArray
          (GPUShader5FmaAccuracyTest *this,char *description,GLfloat *data,GLuint length)

{
  size_t sVar1;
  ulong uVar2;
  MessageBuilder message;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  local_1b0 = (undefined1  [8])
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (description == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar1 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,description,sVar1);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"| ",2);
  if (length != 0) {
    uVar2 = 0;
    do {
      std::ostream::_M_insert<double>((double)data[uVar2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," | ",3);
      uVar2 = uVar2 + 1;
    } while (length != uVar2);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GPUShader5FmaAccuracyTest::logArray(const char* description, glw::GLfloat* data, glw::GLuint length)
{
	m_testCtx.getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;

	tcu::MessageBuilder message = m_testCtx.getLog() << tcu::TestLog::Message;

	message << "| ";

	for (glw::GLuint i = 0; i < length; ++i)
	{
		message << data[i] << " | ";
	}

	message << tcu::TestLog::EndMessage;
}